

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-defend.c
# Opt level: O0

wchar_t borg_calculate_defense_effectiveness(wchar_t what,wchar_t p1)

{
  wchar_t p1_local;
  wchar_t what_local;
  
  switch(what) {
  case L'\0':
    p1_local = borg_defend_aux_bless(p1);
    break;
  case L'\x01':
    p1_local = borg_defend_aux_speed(p1);
    break;
  case L'\x02':
    p1_local = borg_defend_aux_grim_purpose(p1);
    break;
  case L'\x03':
    p1_local = borg_defend_aux_resist_fecap(p1);
    break;
  case L'\x04':
    p1_local = borg_defend_aux_resist_f(p1);
    break;
  case L'\x05':
    p1_local = borg_defend_aux_resist_c(p1);
    break;
  case L'\x06':
    p1_local = borg_defend_aux_resist_a(p1);
    break;
  case L'\a':
    p1_local = borg_defend_aux_resist_e(p1);
    break;
  case L'\b':
    p1_local = borg_defend_aux_resist_p(p1);
    break;
  case L'\t':
    p1_local = borg_defend_aux_prot_evil(p1);
    break;
  case L'\n':
    p1_local = borg_defend_aux_shield(p1);
    break;
  case L'\v':
    p1_local = borg_defend_aux_tele_away(p1);
    break;
  case L'\f':
    p1_local = borg_defend_aux_hero(p1);
    break;
  case L'\r':
    p1_local = borg_defend_aux_berserk(p1);
    break;
  case L'\x0e':
    p1_local = borg_defend_aux_smite_evil(p1);
    break;
  case L'\x0f':
    p1_local = borg_defend_aux_regen(p1);
    break;
  case L'\x10':
    p1_local = borg_defend_aux_glyph(p1);
    break;
  case L'\x11':
    p1_local = borg_defend_aux_create_door(p1);
    break;
  case L'\x12':
    p1_local = borg_defend_aux_mass_genocide(p1);
    break;
  case L'\x13':
    p1_local = borg_defend_aux_genocide(p1);
    break;
  case L'\x14':
    p1_local = borg_defend_aux_genocide_nasties(p1);
    break;
  case L'\x15':
    p1_local = borg_defend_aux_earthquake(p1);
    break;
  case L'\x16':
    p1_local = borg_defend_aux_destruction(p1);
    break;
  case L'\x17':
    p1_local = borg_defend_aux_teleportlevel(p1);
    break;
  case L'\x18':
    p1_local = borg_defend_aux_banishment(p1);
    break;
  case L'\x19':
    p1_local = borg_defend_aux_inviso(p1);
    break;
  case L'\x1a':
    p1_local = borg_defend_aux_lbeam(p1);
    break;
  case L'\x1b':
    p1_local = borg_defend_aux_panel_shift();
    break;
  case L'\x1c':
    p1_local = borg_defend_aux_rest();
    break;
  case L'\x1d':
    p1_local = borg_defend_aux_tele_away_morgoth();
    break;
  case L'\x1e':
    p1_local = borg_defend_aux_banishment_morgoth();
    break;
  case L'\x1f':
    p1_local = borg_defend_aux_light_morgoth();
    break;
  default:
    p1_local = L'\0';
  }
  return p1_local;
}

Assistant:

static int borg_calculate_defense_effectiveness(int what, int p1)
{
    /* Analyze */
    switch (what) {
    case BD_SPEED: {
        return (borg_defend_aux_speed(p1));
    }
    case BD_PROT_FROM_EVIL: {
        return (borg_defend_aux_prot_evil(p1));
    }
    case BD_GRIM_PURPOSE: {
        return (borg_defend_aux_grim_purpose(p1));
    }
    case BD_RESIST_FECAP: {
        return (borg_defend_aux_resist_fecap(p1));
    }
    case BD_RESIST_F: {
        return (borg_defend_aux_resist_f(p1));
    }
    case BD_RESIST_C: {
        return (borg_defend_aux_resist_c(p1));
    }
    case BD_RESIST_A: {
        return (borg_defend_aux_resist_a(p1));
    }
    case BD_RESIST_E: {
        return (borg_defend_aux_resist_e(p1));
    }
    case BD_RESIST_P: {
        return (borg_defend_aux_resist_p(p1));
    }
    case BD_BLESS: {
        return (borg_defend_aux_bless(p1));
    }
    case BD_HERO: {
        return (borg_defend_aux_hero(p1));
    }
    case BD_BERSERK: {
        return (borg_defend_aux_berserk(p1));
    }
    case BD_SMITE_EVIL: {
        return (borg_defend_aux_smite_evil(p1));
    }
    case BD_REGEN: {
        return (borg_defend_aux_regen(p1));
    }
    case BD_SHIELD: {
        return (borg_defend_aux_shield(p1));
    }
    case BD_TELE_AWAY: {
        return (borg_defend_aux_tele_away(p1));
    }
    case BD_GLYPH: {
        return (borg_defend_aux_glyph(p1));
    }
    case BD_CREATE_DOOR: {
        return (borg_defend_aux_create_door(p1));
    }
    case BD_MASS_GENOCIDE: {
        return (borg_defend_aux_mass_genocide(p1));
    }
    case BD_GENOCIDE: {
        return (borg_defend_aux_genocide(p1));
    }
    case BD_GENOCIDE_NASTIES: {
        return (borg_defend_aux_genocide_nasties(p1));
    }
    case BD_EARTHQUAKE: {
        return (borg_defend_aux_earthquake(p1));
    }
    case BD_TPORTLEVEL: {
        return (borg_defend_aux_teleportlevel(p1));
    }
    case BD_DESTRUCTION: {
        return (borg_defend_aux_destruction(p1));
    }
    case BD_BANISHMENT: {
        return (borg_defend_aux_banishment(p1));
    }
    case BD_DETECT_INVISO: {
        return (borg_defend_aux_inviso(p1));
    }
    case BD_LIGHT_BEAM: {
        return (borg_defend_aux_lbeam(p1));
    }
    case BD_SHIFT_PANEL: {
        return (borg_defend_aux_panel_shift());
    }
    case BD_REST: {
        return (borg_defend_aux_rest());
    }
    case BD_TELE_AWAY_MORGOTH: {
        return (borg_defend_aux_tele_away_morgoth());
    }
    case BD_BANISHMENT_MORGOTH: {
        return (borg_defend_aux_banishment_morgoth());
    }
    case BD_LIGHT_MORGOTH: {
        return (borg_defend_aux_light_morgoth());
    }
    }
    return 0;
}